

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance_array.cpp
# Opt level: O3

BBox3fa * __thiscall
embree::InstanceArray::boundSegment
          (BBox3fa *__return_storage_ptr__,InstanceArray *this,size_t i,size_t itime,BBox3fa *obbox0
          ,BBox3fa *obbox1,BBox3fa *bbox0,BBox3fa *bbox1,float tmin,float tmax)

{
  float *pfVar1;
  float fVar2;
  undefined8 uVar3;
  RTCFormat RVar4;
  RawBufferView *pRVar5;
  char *pcVar6;
  RawBufferView *pRVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  bool bVar14;
  uint uVar15;
  ulong uVar16;
  BBox3fa *delta;
  long lVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float in_XMM4_Da;
  float in_XMM4_Db;
  float in_XMM4_Dc;
  float in_XMM4_Dd;
  float fVar27;
  float in_XMM6_Da;
  float in_XMM6_Db;
  float in_XMM6_Dc;
  float in_XMM6_Dd;
  float fVar28;
  undefined1 in_XMM7 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 in_XMM8 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar39;
  undefined1 auVar38 [16];
  float in_XMM11_Da;
  float fVar40;
  float in_XMM11_Db;
  float in_XMM11_Dc;
  float fVar41;
  float in_XMM11_Dd;
  float in_XMM12_Da;
  float fVar42;
  float in_XMM12_Db;
  float in_XMM12_Dc;
  float in_XMM12_Dd;
  float in_XMM13_Da;
  float fVar43;
  float fVar44;
  float fVar45;
  float in_XMM13_Db;
  float fVar46;
  float fVar47;
  float fVar48;
  float in_XMM13_Dc;
  float fVar49;
  float fVar50;
  float fVar51;
  float in_XMM13_Dd;
  float fVar52;
  float in_XMM14_Da;
  float fVar53;
  float in_XMM14_Db;
  float fVar54;
  float in_XMM14_Dc;
  float fVar55;
  float in_XMM14_Dd;
  float fVar56;
  float in_XMM15_Da;
  float fVar57;
  float in_XMM15_Db;
  float in_XMM15_Dc;
  float in_XMM15_Dd;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  Vec3fa nom;
  undefined1 local_458 [8];
  undefined4 uStack_450;
  float fStack_44c;
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  Vec3fa denom;
  float fStack_3e4;
  Vec3fa pt;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_318;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  BBox3fa bt;
  
  if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
    pRVar7 = (this->l2w_buf).items;
    pRVar5 = pRVar7 + itime;
    RVar4 = pRVar7[itime].format;
    if ((int)RVar4 < 0x9244) {
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar17 = pRVar5->stride * i;
        denom.field_0.m128[1] = (float)*(undefined4 *)(pcVar6 + lVar17 + 0x10);
        denom.field_0.m128[0] = (float)*(undefined4 *)(pcVar6 + lVar17);
        denom.field_0.m128[2] = (float)*(undefined4 *)(pcVar6 + lVar17 + 0x20);
        denom.field_0.m128[3] = 0.0;
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        lVar17 = pRVar5->stride * i;
        uVar3 = *(undefined8 *)(pRVar5->ptr_ofs + lVar17 + 4);
        denom.field_0.m128[1] = (float)(int)uVar3;
        denom.field_0.m128[0] = (float)*(undefined4 *)(pRVar5->ptr_ofs + lVar17);
        denom.field_0.m128[2] = (float)(int)((ulong)uVar3 >> 0x20);
        denom.field_0.m128[3] = 0.0;
      }
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar17 = pRVar5->stride * i;
      denom.field_0.m128[1] = (float)*(undefined4 *)(pcVar6 + lVar17 + 0x34);
      denom.field_0.m128[0] = (float)*(undefined4 *)(pcVar6 + lVar17);
      denom.field_0.m128[2] = *(float *)(pcVar6 + lVar17 + 0x38);
      fVar24 = *(float *)(pcVar6 + lVar17 + 0x28);
      fVar26 = *(float *)(pcVar6 + lVar17 + 0x30) * *(float *)(pcVar6 + lVar17 + 0x30) +
               *(float *)(pcVar6 + lVar17 + 0x2c) * *(float *)(pcVar6 + lVar17 + 0x2c) +
               *(float *)(pcVar6 + lVar17 + 0x24) * *(float *)(pcVar6 + lVar17 + 0x24) +
               fVar24 * fVar24;
      auVar38 = rsqrtss(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
      fVar25 = auVar38._0_4_;
      denom.field_0.m128[3] = fVar24 * (fVar25 * fVar25 * fVar26 * -0.5 * fVar25 + fVar25 * 1.5);
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      denom.field_0 =
           *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pRVar5->ptr_ofs + pRVar5->stride * i);
    }
    RVar4 = pRVar5[1].format;
    if ((int)RVar4 < 0x9244) {
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar6 = pRVar5[1].ptr_ofs;
        lVar17 = i * pRVar5[1].stride;
        nom.field_0.m128[1] = (float)*(undefined4 *)(pcVar6 + lVar17 + 0x10);
        nom.field_0.m128[0] = (float)*(undefined4 *)(pcVar6 + lVar17);
        nom.field_0.m128[2] = (float)*(undefined4 *)(pcVar6 + lVar17 + 0x20);
        nom.field_0.m128[3] = 0.0;
        local_458._4_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x14);
        local_458._0_4_ = *(undefined4 *)(pcVar6 + lVar17 + 4);
        uStack_450 = *(undefined4 *)(pcVar6 + lVar17 + 0x24);
        fStack_44c = 0.0;
        local_448._4_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x18);
        local_448._0_4_ = *(undefined4 *)(pcVar6 + lVar17 + 8);
        local_448._8_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x28);
        local_448._12_4_ = 0;
        local_438._4_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x1c);
        local_438._0_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0xc);
        local_438._8_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x2c);
        local_438._12_4_ = 0;
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5[1].ptr_ofs;
        lVar17 = i * pRVar5[1].stride;
        nom.field_0.m128[1] = (float)(int)*(undefined8 *)(pcVar6 + lVar17 + 4);
        nom.field_0.m128[0] = (float)*(undefined4 *)(pcVar6 + lVar17);
        nom.field_0.m128[2] = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 4) >> 0x20);
        nom.field_0.m128[3] = 0.0;
        local_458._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar17 + 0x10);
        local_458._0_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0xc);
        uStack_450 = (int)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x10) >> 0x20);
        fStack_44c = 0.0;
        local_448._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar17 + 0x1c);
        local_448._0_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x18);
        local_448._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x1c) >> 0x20);
        local_448._12_4_ = 0;
        local_438._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar17 + 0x28);
        local_438._0_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x24);
        local_438._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x28) >> 0x20);
        local_438._12_4_ = 0;
      }
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5[1].ptr_ofs;
      lVar17 = i * pRVar5[1].stride;
      local_458._4_4_ = *(undefined4 *)(pcVar6 + lVar17 + 4);
      local_448._8_4_ = *(undefined4 *)(pcVar6 + lVar17 + 8);
      local_458._0_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0xc);
      local_448._4_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x14);
      local_448._0_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x10);
      nom.field_0.m128[1] = (float)*(undefined4 *)(pcVar6 + lVar17 + 0x34);
      nom.field_0.m128[0] = (float)*(undefined4 *)(pcVar6 + lVar17);
      nom.field_0.m128[2] = *(float *)(pcVar6 + lVar17 + 0x38);
      uStack_450 = *(undefined4 *)(pcVar6 + lVar17 + 0x3c);
      local_438._4_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x1c);
      local_438._0_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x18);
      local_438._8_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x20);
      fVar24 = *(float *)(pcVar6 + lVar17 + 0x24);
      fVar25 = *(float *)(pcVar6 + lVar17 + 0x28);
      fVar26 = *(float *)(pcVar6 + lVar17 + 0x2c);
      fVar35 = *(float *)(pcVar6 + lVar17 + 0x30);
      fVar30 = fVar35 * fVar35 + fVar26 * fVar26 + fVar24 * fVar24 + fVar25 * fVar25;
      auVar38 = rsqrtss(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
      fVar40 = auVar38._0_4_;
      fVar40 = fVar40 * fVar40 * fVar30 * -0.5 * fVar40 + fVar40 * 1.5;
      nom.field_0.m128[3] = fVar25 * fVar40;
      fStack_44c = fVar26 * fVar40;
      local_448._12_4_ = fVar40 * fVar35;
      local_438._12_4_ = fVar24 * fVar40;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5[1].ptr_ofs;
      lVar17 = i * pRVar5[1].stride;
      nom.field_0 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pcVar6 + lVar17);
      _local_458 = *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)
                    ((anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar6 + lVar17 + 0x10))->m128;
      local_448 = *(undefined1 (*) [16])
                   ((anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar6 + lVar17 + 0x20))->m128;
      local_438 = *(undefined1 (*) [16])
                   ((anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar6 + lVar17 + 0x30))->m128;
    }
    MotionDerivativeCoefficients::MotionDerivativeCoefficients
              ((MotionDerivativeCoefficients *)&bt,(AffineSpace3ff *)&denom,(AffineSpace3ff *)&nom);
    pt.field_0._0_8_ = denom.field_0._0_8_;
    pt.field_0._8_8_ = denom.field_0._8_8_;
    local_318._0_8_ = nom.field_0._0_8_;
    local_318._8_8_ = nom.field_0._8_8_;
    local_308 = local_458;
    uStack_300 = _uStack_450;
    local_2f8 = local_448._0_8_;
    uStack_2f0 = local_448._8_8_;
    local_2e8 = local_438._0_8_;
    uStack_2e0 = local_438._8_8_;
    anon_unknown_117::boundSegmentNonlinear
              (__return_storage_ptr__,(MotionDerivativeCoefficients *)&bt,(AffineSpace3fa *)&pt,
               (AffineSpace3fa *)&local_318.field_1,obbox0,obbox1,bbox0,bbox1,tmin,tmax);
    return __return_storage_ptr__;
  }
  if ((this->super_Geometry).numTimeSteps == 1) {
    pRVar5 = (this->l2w_buf).items;
    RVar4 = pRVar5->format;
    if ((int)RVar4 < 0x9244) {
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar17 = pRVar5->stride * i;
        in_XMM6_Db = *(float *)(pcVar6 + lVar17 + 0x10);
        in_XMM6_Da = *(float *)(pcVar6 + lVar17);
        in_XMM13_Da = *(float *)(pcVar6 + lVar17 + 4);
        in_XMM14_Da = *(float *)(pcVar6 + lVar17 + 8);
        uVar20 = *(undefined4 *)(pcVar6 + lVar17 + 0xc);
        in_XMM6_Dc = *(float *)(pcVar6 + lVar17 + 0x20);
        in_XMM13_Db = *(float *)(pcVar6 + lVar17 + 0x14);
        in_XMM13_Dc = *(float *)(pcVar6 + lVar17 + 0x24);
        in_XMM14_Db = *(float *)(pcVar6 + lVar17 + 0x18);
        in_XMM14_Dc = *(float *)(pcVar6 + lVar17 + 0x28);
        uVar18 = *(undefined4 *)(pcVar6 + lVar17 + 0x1c);
        uVar19 = *(undefined4 *)(pcVar6 + lVar17 + 0x2c);
      }
      else {
        if (RVar4 != RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) goto LAB_00964419;
        pcVar6 = pRVar5->ptr_ofs;
        lVar17 = pRVar5->stride * i;
        in_XMM6_Db = (float)*(undefined8 *)(pcVar6 + lVar17 + 4);
        in_XMM6_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 4) >> 0x20);
        in_XMM6_Da = *(float *)(pcVar6 + lVar17);
        in_XMM13_Db = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x10);
        in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x10) >> 0x20);
        in_XMM13_Da = *(float *)(pcVar6 + lVar17 + 0xc);
        in_XMM14_Db = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x1c);
        in_XMM14_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x1c) >> 0x20);
        in_XMM14_Da = *(float *)(pcVar6 + lVar17 + 0x18);
        uVar18 = (undefined4)*(undefined8 *)(pcVar6 + lVar17 + 0x28);
        uVar19 = (undefined4)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x28) >> 0x20);
        uVar20 = *(undefined4 *)(pcVar6 + lVar17 + 0x24);
      }
      in_XMM14_Dd = 0.0;
      in_XMM13_Dd = 0.0;
      in_XMM6_Dd = 0.0;
      local_518._4_4_ = uVar18;
      local_518._0_4_ = uVar20;
      fStack_510 = (float)uVar19;
      fStack_50c = 0.0;
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar17 = pRVar5->stride * i;
      in_XMM14_Da = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x10);
      in_XMM14_Db = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x10) >> 0x20);
      in_XMM6_Db = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x34);
      in_XMM6_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x34) >> 0x20);
      in_XMM6_Da = *(float *)(pcVar6 + lVar17);
      in_XMM13_Db = *(float *)(pcVar6 + lVar17 + 4);
      in_XMM14_Dc = *(float *)(pcVar6 + lVar17 + 8);
      in_XMM13_Da = *(float *)(pcVar6 + lVar17 + 0xc);
      fVar24 = *(float *)(pcVar6 + lVar17 + 0x24);
      fVar25 = *(float *)(pcVar6 + lVar17 + 0x28);
      fVar26 = *(float *)(pcVar6 + lVar17 + 0x2c);
      fVar35 = *(float *)(pcVar6 + lVar17 + 0x30);
      fVar30 = fVar35 * fVar35 + fVar26 * fVar26 + fVar24 * fVar24 + fVar25 * fVar25;
      auVar38 = rsqrtss(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
      fVar40 = auVar38._0_4_;
      fVar30 = fVar30 * -0.5 * fVar40;
      in_XMM8 = ZEXT416((uint)fVar30);
      fVar40 = fVar40 * fVar40 * fVar30 + fVar40 * 1.5;
      in_XMM6_Dd = fVar25 * fVar40;
      in_XMM13_Dd = fVar26 * fVar40;
      in_XMM14_Dd = fVar40 * fVar35;
      in_XMM13_Dc = *(float *)(pcVar6 + lVar17 + 0x3c);
      local_518._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar17 + 0x1c);
      local_518._0_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x18);
      fStack_510 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x1c) >> 0x20);
      fStack_50c = fVar24 * fVar40;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar17 = pRVar5->stride * i;
      pfVar1 = (float *)(pcVar6 + lVar17);
      in_XMM6_Da = *pfVar1;
      in_XMM6_Db = pfVar1[1];
      in_XMM6_Dc = pfVar1[2];
      in_XMM6_Dd = pfVar1[3];
      pfVar1 = (float *)(pcVar6 + lVar17 + 0x10);
      in_XMM13_Da = *pfVar1;
      in_XMM13_Db = pfVar1[1];
      in_XMM13_Dc = pfVar1[2];
      in_XMM13_Dd = pfVar1[3];
      pfVar1 = (float *)(pcVar6 + lVar17 + 0x20);
      in_XMM14_Da = *pfVar1;
      in_XMM14_Db = pfVar1[1];
      in_XMM14_Dc = pfVar1[2];
      in_XMM14_Dd = pfVar1[3];
      _local_518 = *(undefined1 (*) [16])(pcVar6 + lVar17 + 0x30);
    }
LAB_00964419:
    RVar4 = pRVar5->format;
    if ((int)RVar4 < 0x9244) {
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar17 = i * pRVar5->stride;
        in_XMM8._4_4_ = (float)*(undefined4 *)(pcVar6 + lVar17 + 0x10);
        in_XMM8._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar17);
        in_XMM12_Da = *(float *)(pcVar6 + lVar17 + 4);
        in_XMM15_Da = *(float *)(pcVar6 + lVar17 + 8);
        local_528 = *(float *)(pcVar6 + lVar17 + 0xc);
        in_XMM8._8_4_ = (float)*(undefined4 *)(pcVar6 + lVar17 + 0x20);
        in_XMM8._12_4_ = 0.0;
        in_XMM12_Db = *(float *)(pcVar6 + lVar17 + 0x14);
        in_XMM12_Dc = *(float *)(pcVar6 + lVar17 + 0x24);
        in_XMM12_Dd = 0.0;
        in_XMM15_Db = *(float *)(pcVar6 + lVar17 + 0x18);
        in_XMM15_Dc = *(float *)(pcVar6 + lVar17 + 0x28);
        in_XMM15_Dd = 0.0;
        fStack_524 = *(float *)(pcVar6 + lVar17 + 0x1c);
        fStack_520 = *(float *)(pcVar6 + lVar17 + 0x2c);
        fStack_51c = 0.0;
      }
      else {
        if (RVar4 != RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) goto LAB_009651ba;
        pcVar6 = pRVar5->ptr_ofs;
        lVar17 = i * pRVar5->stride;
        in_XMM8._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar17 + 4);
        in_XMM8._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar17);
        in_XMM8._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 4) >> 0x20);
        in_XMM8._12_4_ = 0.0;
        in_XMM12_Db = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x10);
        in_XMM12_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x10) >> 0x20);
        in_XMM12_Da = *(float *)(pcVar6 + lVar17 + 0xc);
        in_XMM12_Dd = 0.0;
        in_XMM15_Db = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x1c);
        in_XMM15_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x1c) >> 0x20);
        in_XMM15_Da = *(float *)(pcVar6 + lVar17 + 0x18);
        in_XMM15_Dd = 0.0;
        fStack_524 = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x28);
        fStack_520 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x28) >> 0x20);
        local_528 = *(float *)(pcVar6 + lVar17 + 0x24);
        fStack_51c = 0.0;
      }
    }
    else {
      if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar17 = i * pRVar5->stride;
        in_XMM15_Da = *(float *)(pcVar6 + lVar17 + 0x10);
        in_XMM15_Db = *(float *)((long)(pcVar6 + lVar17 + 0x10) + 4);
        in_XMM12_Db = *(float *)(pcVar6 + lVar17 + 4);
        in_XMM15_Dc = *(float *)(pcVar6 + lVar17 + 8);
        in_XMM12_Da = *(float *)(pcVar6 + lVar17 + 0xc);
        local_528 = *(float *)(pcVar6 + lVar17 + 0x18);
        fStack_524 = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x1c);
        fStack_520 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x1c) >> 0x20);
        fStack_51c = *(float *)(pcVar6 + lVar17 + 0x24);
        fVar24 = *(float *)(pcVar6 + lVar17 + 0x28);
        fVar25 = *(float *)(pcVar6 + lVar17 + 0x2c);
        fVar26 = *(float *)(pcVar6 + lVar17 + 0x30);
        fVar40 = fVar26 * fVar26 + fVar25 * fVar25 + fStack_51c * fStack_51c + fVar24 * fVar24;
        auVar38 = rsqrtss(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
        fVar35 = auVar38._0_4_;
        fVar35 = fVar35 * fVar35 * fVar40 * -0.5 * fVar35 + fVar35 * 1.5;
        fStack_51c = fStack_51c * fVar35;
        in_XMM12_Dd = fVar25 * fVar35;
        in_XMM15_Dd = fVar35 * fVar26;
        in_XMM8._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar17 + 0x34);
        in_XMM8._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar17);
        in_XMM8._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x34) >> 0x20);
        in_XMM8._12_4_ = fVar24 * fVar35;
        in_XMM12_Dc = *(float *)(pcVar6 + lVar17 + 0x3c);
        goto LAB_009651b6;
      }
      if (RVar4 != RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) goto LAB_009651ba;
      pcVar6 = pRVar5->ptr_ofs;
      lVar17 = i * pRVar5->stride;
      in_XMM8 = *(undefined1 (*) [16])(pcVar6 + lVar17);
      pfVar1 = (float *)(pcVar6 + lVar17 + 0x10);
      in_XMM12_Da = *pfVar1;
      in_XMM12_Db = pfVar1[1];
      in_XMM12_Dc = pfVar1[2];
      in_XMM12_Dd = pfVar1[3];
      pfVar1 = (float *)(pcVar6 + lVar17 + 0x20);
      in_XMM15_Da = *pfVar1;
      in_XMM15_Db = pfVar1[1];
      in_XMM15_Dc = pfVar1[2];
      in_XMM15_Dd = pfVar1[3];
      pcVar6 = pcVar6 + lVar17 + 0x30;
      local_528 = *(float *)pcVar6;
      fStack_524 = *(float *)(pcVar6 + 4);
      fStack_520 = *(float *)(pcVar6 + 8);
      fStack_51c = *(float *)(pcVar6 + 0xc);
    }
  }
  else {
    local_518._0_4_ = (this->super_Geometry).fnumTimeSegments;
    fVar24 = (this->super_Geometry).time_range.lower;
    fVar25 = 0.0;
    fVar26 = 0.0;
    fVar35 = 0.0;
    fVar40 = (((float)itime - fVar24) / ((this->super_Geometry).time_range.upper - fVar24)) *
             (float)local_518._0_4_;
    fVar30 = floorf(fVar40);
    if ((float)local_518._0_4_ + -1.0 <= fVar30) {
      fVar30 = (float)local_518._0_4_ + -1.0;
    }
    fVar28 = 0.0;
    if (0.0 <= fVar30) {
      fVar28 = fVar30;
    }
    uVar15 = (uint)fVar28;
    pRVar7 = (this->l2w_buf).items;
    pRVar5 = pRVar7 + uVar15;
    RVar4 = pRVar7[uVar15].format;
    if ((int)RVar4 < 0x9244) {
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar17 = pRVar5->stride * i;
        in_XMM12_Da = *(float *)(pcVar6 + lVar17 + 4);
        in_XMM13_Da = *(float *)(pcVar6 + lVar17 + 8);
        fVar24 = *(float *)(pcVar6 + lVar17 + 0xc);
        in_XMM12_Db = *(float *)(pcVar6 + lVar17 + 0x14);
        in_XMM12_Dc = *(float *)(pcVar6 + lVar17 + 0x24);
        in_XMM12_Dd = 0.0;
        in_XMM13_Db = *(float *)(pcVar6 + lVar17 + 0x18);
        in_XMM13_Dc = *(float *)(pcVar6 + lVar17 + 0x28);
        in_XMM13_Dd = 0.0;
        fVar25 = *(float *)(pcVar6 + lVar17 + 0x1c);
        fVar26 = *(float *)(pcVar6 + lVar17 + 0x2c);
        local_518._4_4_ = fVar25;
        local_518._0_4_ = fVar24;
        fStack_510 = fVar26;
        fStack_50c = 0.0;
        in_XMM4_Da = *(float *)(pcVar6 + lVar17);
        in_XMM4_Db = *(float *)(pcVar6 + lVar17 + 0x10);
        in_XMM4_Dc = *(float *)(pcVar6 + lVar17 + 0x20);
        in_XMM4_Dd = 0.0;
LAB_00964666:
        fVar35 = 0.0;
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar17 = pRVar5->stride * i;
        in_XMM4_Db = (float)*(undefined8 *)(pcVar6 + lVar17 + 4);
        in_XMM4_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 4) >> 0x20);
        in_XMM4_Da = *(float *)(pcVar6 + lVar17);
        in_XMM4_Dd = 0.0;
        in_XMM12_Db = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x10);
        in_XMM12_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x10) >> 0x20);
        in_XMM12_Da = *(float *)(pcVar6 + lVar17 + 0xc);
        in_XMM12_Dd = 0.0;
        in_XMM13_Db = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x1c);
        in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x1c) >> 0x20);
        in_XMM13_Da = *(float *)(pcVar6 + lVar17 + 0x18);
        in_XMM13_Dd = 0.0;
        fVar25 = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x28);
        fVar26 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x28) >> 0x20);
        fVar24 = *(float *)(pcVar6 + lVar17 + 0x24);
        fVar35 = 0.0;
        local_518._4_4_ = fVar25;
        local_518._0_4_ = fVar24;
        fStack_510 = fVar26;
        fStack_50c = 0.0;
      }
    }
    else {
      if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar17 = pRVar5->stride * i;
        in_XMM13_Da = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x10);
        in_XMM13_Db = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x10) >> 0x20);
        in_XMM11_Db = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x34);
        in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x34) >> 0x20);
        in_XMM11_Da = *(float *)(pcVar6 + lVar17);
        in_XMM12_Db = *(float *)(pcVar6 + lVar17 + 4);
        in_XMM13_Dc = *(float *)(pcVar6 + lVar17 + 8);
        in_XMM12_Da = *(float *)(pcVar6 + lVar17 + 0xc);
        fVar24 = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x1c);
        fVar25 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x1c) >> 0x20);
        fVar26 = 0.0;
        fVar35 = *(float *)(pcVar6 + lVar17 + 0x24);
        in_XMM11_Dd = *(float *)(pcVar6 + lVar17 + 0x28);
        fVar30 = *(float *)(pcVar6 + lVar17 + 0x2c);
        fVar32 = *(float *)(pcVar6 + lVar17 + 0x30);
        in_XMM7 = ZEXT416((uint)fVar32);
        fVar34 = fVar32 * fVar32 + fVar30 * fVar30 + fVar35 * fVar35 + in_XMM11_Dd * in_XMM11_Dd;
        auVar38 = rsqrtss(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34));
        fVar31 = auVar38._0_4_;
        fVar31 = fVar31 * fVar31 * fVar34 * -0.5 * fVar31 + fVar31 * 1.5;
        in_XMM11_Dd = in_XMM11_Dd * fVar31;
        in_XMM12_Dd = fVar30 * fVar31;
        auVar38._0_4_ = fVar31 * fVar32;
        in_XMM8._0_8_ = auVar38._0_8_;
        in_XMM8._8_4_ = in_XMM13_Dc;
        in_XMM8._12_4_ = 0.0;
        in_XMM12_Dc = *(float *)(pcVar6 + lVar17 + 0x3c);
        local_518._4_4_ = fVar24;
        local_518._0_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x18);
        fStack_510 = fVar25;
        fStack_50c = fVar35 * fVar31;
        in_XMM13_Dd = auVar38._0_4_;
        in_XMM4_Da = in_XMM11_Da;
        in_XMM4_Db = in_XMM11_Db;
        in_XMM4_Dc = in_XMM11_Dc;
        in_XMM4_Dd = in_XMM11_Dd;
        goto LAB_00964666;
      }
      if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar17 = pRVar5->stride * i;
        pfVar1 = (float *)(pcVar6 + lVar17);
        in_XMM4_Da = *pfVar1;
        in_XMM4_Db = pfVar1[1];
        in_XMM4_Dc = pfVar1[2];
        in_XMM4_Dd = pfVar1[3];
        pfVar1 = (float *)(pcVar6 + lVar17 + 0x10);
        in_XMM12_Da = *pfVar1;
        in_XMM12_Db = pfVar1[1];
        in_XMM12_Dc = pfVar1[2];
        in_XMM12_Dd = pfVar1[3];
        pfVar1 = (float *)(pcVar6 + lVar17 + 0x20);
        in_XMM13_Da = *pfVar1;
        in_XMM13_Db = pfVar1[1];
        in_XMM13_Dc = pfVar1[2];
        in_XMM13_Dd = pfVar1[3];
        _local_518 = *(undefined1 (*) [16])(pcVar6 + lVar17 + 0x30);
      }
    }
    fVar40 = fVar40 - fVar28;
    pRVar5 = pRVar7 + (uVar15 + 1);
    RVar4 = pRVar7[uVar15 + 1].format;
    if ((int)RVar4 < 0x9244) {
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar17 = pRVar5->stride * i;
        fVar24 = *(float *)(pcVar6 + lVar17 + 4);
        local_4a8._4_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x10);
        local_4a8._0_4_ = *(undefined4 *)(pcVar6 + lVar17);
        fStack_4a0 = (float)*(undefined4 *)(pcVar6 + lVar17 + 0x20);
        fStack_49c = 0.0;
        fVar25 = *(float *)(pcVar6 + lVar17 + 0x14);
        fVar26 = *(float *)(pcVar6 + lVar17 + 0x24);
        fVar35 = 0.0;
        in_XMM8._4_4_ = (float)*(undefined4 *)(pcVar6 + lVar17 + 0x18);
        in_XMM8._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar17 + 8);
        in_XMM8._8_4_ = (float)*(undefined4 *)(pcVar6 + lVar17 + 0x28);
        in_XMM8._12_4_ = 0.0;
        local_4b8._4_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x1c);
        local_4b8._0_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0xc);
        fStack_4b0 = (float)*(undefined4 *)(pcVar6 + lVar17 + 0x2c);
        fStack_4ac = 0.0;
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar17 = pRVar5->stride * i;
        local_4a8._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar17 + 4);
        local_4a8._0_4_ = *(undefined4 *)(pcVar6 + lVar17);
        fStack_4a0 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 4) >> 0x20);
        fStack_49c = 0.0;
        fVar25 = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x10);
        fVar26 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x10) >> 0x20);
        fVar24 = *(float *)(pcVar6 + lVar17 + 0xc);
        fVar35 = 0.0;
        in_XMM8._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar17 + 0x1c);
        in_XMM8._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar17 + 0x18);
        in_XMM8._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x1c) >> 0x20);
        in_XMM8._12_4_ = 0.0;
        local_4b8._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar17 + 0x28);
        local_4b8._0_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x24);
        fStack_4b0 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x28) >> 0x20);
        fStack_4ac = 0.0;
      }
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar17 = pRVar5->stride * i;
      in_XMM11_Db = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x34);
      in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x34) >> 0x20);
      in_XMM11_Da = *(float *)(pcVar6 + lVar17);
      fVar25 = *(float *)(pcVar6 + lVar17 + 4);
      fVar24 = *(float *)(pcVar6 + lVar17 + 0xc);
      fVar30 = *(float *)(pcVar6 + lVar17 + 0x24);
      in_XMM11_Dd = *(float *)(pcVar6 + lVar17 + 0x28);
      fVar35 = *(float *)(pcVar6 + lVar17 + 0x2c);
      fVar26 = *(float *)(pcVar6 + lVar17 + 0x30);
      fVar32 = fVar26 * fVar26 + fVar35 * fVar35 + fVar30 * fVar30 + in_XMM11_Dd * in_XMM11_Dd;
      auVar38 = rsqrtss(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32));
      fVar28 = auVar38._0_4_;
      auVar29._4_12_ = auVar38._4_12_;
      fVar28 = fVar28 * fVar28 * fVar32 * -0.5 * fVar28 + fVar28 * 1.5;
      in_XMM11_Dd = in_XMM11_Dd * fVar28;
      fVar35 = fVar35 * fVar28;
      auVar29._0_4_ = fVar28 * fVar26;
      in_XMM7._0_8_ = auVar29._0_8_;
      in_XMM7._8_4_ = *(undefined4 *)(pcVar6 + lVar17 + 8);
      in_XMM7._12_4_ = 0;
      in_XMM8._8_4_ = (float)*(undefined4 *)(pcVar6 + lVar17 + 8);
      in_XMM8._0_8_ = *(undefined8 *)(pcVar6 + lVar17 + 0x10);
      in_XMM8._12_4_ = auVar29._0_4_;
      local_4a8._4_4_ = in_XMM11_Db;
      local_4a8._0_4_ = in_XMM11_Da;
      fStack_4a0 = in_XMM11_Dc;
      fStack_49c = in_XMM11_Dd;
      fVar26 = *(float *)(pcVar6 + lVar17 + 0x3c);
      local_4b8._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar17 + 0x1c);
      local_4b8._0_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x18);
      fStack_4b0 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x1c) >> 0x20);
      fStack_4ac = fVar30 * fVar28;
      in_XMM15_Da = fVar24;
      in_XMM15_Db = fVar25;
      in_XMM15_Dc = fVar26;
      in_XMM15_Dd = fVar35;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar17 = pRVar5->stride * i;
      _local_4a8 = *(undefined1 (*) [16])(pcVar6 + lVar17);
      pfVar1 = (float *)(pcVar6 + lVar17 + 0x10);
      fVar24 = *pfVar1;
      fVar25 = pfVar1[1];
      fVar26 = pfVar1[2];
      fVar35 = pfVar1[3];
      in_XMM8 = *(undefined1 (*) [16])(pcVar6 + lVar17 + 0x20);
      _local_4b8 = *(undefined1 (*) [16])(pcVar6 + lVar17 + 0x30);
    }
    fVar44 = 1.0 - fVar40;
    fVar30 = (this->super_Geometry).fnumTimeSegments;
    fVar28 = (this->super_Geometry).time_range.lower;
    fVar47 = (((float)(itime + 1) - fVar28) / ((this->super_Geometry).time_range.upper - fVar28)) *
             fVar30;
    auVar33 = in_XMM8;
    fVar28 = in_XMM12_Da;
    fVar32 = in_XMM12_Db;
    fVar31 = in_XMM12_Dc;
    fVar34 = in_XMM12_Dd;
    fVar45 = floorf(fVar47);
    fVar30 = fVar30 + -1.0;
    if (fVar30 <= fVar45) {
      fVar45 = fVar30;
    }
    fVar30 = 0.0;
    if (0.0 <= fVar45) {
      fVar30 = fVar45;
    }
    fVar45 = 0.0;
    fVar48 = 0.0;
    fVar50 = 0.0;
    uVar15 = (uint)fVar30;
    pRVar5 = pRVar7 + uVar15;
    RVar4 = pRVar7[uVar15].format;
    fStack_484 = in_XMM8._4_4_;
    fStack_480 = in_XMM8._8_4_;
    fStack_47c = in_XMM8._12_4_;
    local_488 = in_XMM8._0_4_;
    if ((int)RVar4 < 0x9244) {
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar17 = pRVar5->stride * i;
        auVar33._4_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x10);
        auVar33._0_4_ = *(undefined4 *)(pcVar6 + lVar17);
        fVar28 = *(float *)(pcVar6 + lVar17 + 4);
        in_XMM15_Da = *(float *)(pcVar6 + lVar17 + 8);
        in_XMM11_Da = *(float *)(pcVar6 + lVar17 + 0xc);
        auVar33._8_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x20);
        auVar33._12_4_ = 0;
        fVar32 = *(float *)(pcVar6 + lVar17 + 0x14);
        fVar31 = *(float *)(pcVar6 + lVar17 + 0x24);
        fVar34 = 0.0;
        in_XMM15_Db = *(float *)(pcVar6 + lVar17 + 0x18);
        in_XMM15_Dc = *(float *)(pcVar6 + lVar17 + 0x28);
        in_XMM15_Dd = 0.0;
        in_XMM11_Db = *(float *)(pcVar6 + lVar17 + 0x1c);
        in_XMM11_Dc = *(float *)(pcVar6 + lVar17 + 0x2c);
        in_XMM11_Dd = 0.0;
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar17 = pRVar5->stride * i;
        auVar33._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar17 + 4);
        auVar33._0_4_ = *(undefined4 *)(pcVar6 + lVar17);
        auVar33._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 4) >> 0x20);
        auVar33._12_4_ = 0;
        fVar32 = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x10);
        fVar31 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x10) >> 0x20);
        fVar28 = *(float *)(pcVar6 + lVar17 + 0xc);
        fVar34 = 0.0;
        in_XMM15_Db = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x1c);
        in_XMM15_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x1c) >> 0x20);
        in_XMM15_Da = *(float *)(pcVar6 + lVar17 + 0x18);
        in_XMM15_Dd = 0.0;
        in_XMM11_Db = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x28);
        in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x28) >> 0x20);
        in_XMM11_Da = *(float *)(pcVar6 + lVar17 + 0x24);
        in_XMM11_Dd = 0.0;
      }
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar17 = pRVar5->stride * i;
      in_XMM15_Da = *(float *)(pcVar6 + lVar17 + 0x10);
      in_XMM15_Db = *(float *)((long)(pcVar6 + lVar17 + 0x10) + 4);
      fVar32 = *(float *)(pcVar6 + lVar17 + 4);
      in_XMM15_Dc = *(float *)(pcVar6 + lVar17 + 8);
      fVar28 = *(float *)(pcVar6 + lVar17 + 0xc);
      in_XMM11_Da = *(float *)(pcVar6 + lVar17 + 0x18);
      in_XMM11_Db = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x1c);
      in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x1c) >> 0x20);
      fVar31 = *(float *)(pcVar6 + lVar17 + 0x24);
      fVar51 = *(float *)(pcVar6 + lVar17 + 0x28);
      fVar34 = *(float *)(pcVar6 + lVar17 + 0x2c);
      fVar41 = *(float *)(pcVar6 + lVar17 + 0x30);
      fVar37 = fVar41 * fVar41 + fVar34 * fVar34 + fVar31 * fVar31 + fVar51 * fVar51;
      auVar38 = rsqrtss(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37));
      fVar42 = auVar38._0_4_;
      fVar42 = fVar42 * fVar42 * fVar37 * -0.5 * fVar42 + fVar42 * 1.5;
      in_XMM7._0_4_ = fVar31 * fVar42;
      fVar34 = fVar34 * fVar42;
      in_XMM15_Dd = fVar42 * fVar41;
      auVar33._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar17 + 0x34);
      auVar33._0_4_ = *(undefined4 *)(pcVar6 + lVar17);
      auVar33._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x34) >> 0x20);
      auVar33._12_4_ = fVar51 * fVar42;
      fVar31 = *(float *)(pcVar6 + lVar17 + 0x3c);
      in_XMM7._4_4_ = 0;
      in_XMM7._8_4_ = in_XMM11_Dc;
      in_XMM7._12_4_ = 0;
      in_XMM11_Dd = in_XMM7._0_4_;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar17 = pRVar5->stride * i;
      auVar33 = *(undefined1 (*) [16])(pcVar6 + lVar17);
      pfVar1 = (float *)(pcVar6 + lVar17 + 0x10);
      fVar28 = *pfVar1;
      fVar32 = pfVar1[1];
      fVar31 = pfVar1[2];
      fVar34 = pfVar1[3];
      pfVar1 = (float *)(pcVar6 + lVar17 + 0x20);
      in_XMM15_Da = *pfVar1;
      in_XMM15_Db = pfVar1[1];
      in_XMM15_Dc = pfVar1[2];
      in_XMM15_Dd = pfVar1[3];
      pfVar1 = (float *)(pcVar6 + lVar17 + 0x30);
      in_XMM11_Da = *pfVar1;
      in_XMM11_Db = pfVar1[1];
      in_XMM11_Dc = pfVar1[2];
      in_XMM11_Dd = pfVar1[3];
    }
    fVar36 = (float)local_4a8._0_4_ * fVar40;
    fVar39 = (float)local_4a8._4_4_ * fVar40;
    fStack_4a0 = fStack_4a0 * fVar40;
    fStack_49c = fStack_49c * fVar40;
    in_XMM4_Da = in_XMM4_Da * fVar44;
    in_XMM4_Db = in_XMM4_Db * fVar44;
    in_XMM4_Dc = in_XMM4_Dc * fVar44;
    in_XMM4_Dd = in_XMM4_Dd * fVar44;
    fVar24 = fVar24 * fVar40;
    fVar25 = fVar25 * fVar40;
    fVar26 = fVar26 * fVar40;
    fVar35 = fVar35 * fVar40;
    fVar43 = in_XMM12_Da * fVar44;
    fVar46 = in_XMM12_Db * fVar44;
    fVar49 = in_XMM12_Dc * fVar44;
    fVar52 = in_XMM12_Dd * fVar44;
    local_488 = local_488 * fVar40;
    fStack_484 = fStack_484 * fVar40;
    fStack_480 = fStack_480 * fVar40;
    fStack_47c = fStack_47c * fVar40;
    fVar53 = in_XMM13_Da * fVar44;
    fVar54 = in_XMM13_Db * fVar44;
    fVar55 = in_XMM13_Dc * fVar44;
    fVar56 = in_XMM13_Dd * fVar44;
    fVar21 = (float)local_4b8._0_4_ * fVar40;
    fVar22 = (float)local_4b8._4_4_ * fVar40;
    fStack_4b0 = fStack_4b0 * fVar40;
    fStack_4ac = fStack_4ac * fVar40;
    local_518._0_4_ = (float)local_518._0_4_ * fVar44;
    fVar23 = (float)local_518._4_4_ * fVar44;
    fStack_510 = fStack_510 * fVar44;
    fStack_50c = fStack_50c * fVar44;
    fVar47 = fVar47 - fVar30;
    pRVar5 = pRVar7 + (uVar15 + 1);
    RVar4 = pRVar7[uVar15 + 1].format;
    fVar27 = fVar44;
    fStack_3e4 = fVar44;
    fVar41 = fVar44;
    fVar51 = fVar40;
    fVar37 = fVar40;
    fVar42 = fVar40;
    if ((int)RVar4 < 0x9244) {
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar17 = i * pRVar5->stride;
        fVar44 = *(float *)(pcVar6 + lVar17);
        fVar40 = *(float *)(pcVar6 + lVar17 + 4);
        fVar30 = *(float *)(pcVar6 + lVar17 + 8);
        fVar45 = *(float *)(pcVar6 + lVar17 + 0x18);
        fVar48 = *(float *)(pcVar6 + lVar17 + 0x28);
        fVar50 = 0.0;
        in_XMM7._4_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x1c);
        in_XMM7._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar17 + 0xc);
        in_XMM7._8_4_ = *(undefined4 *)(pcVar6 + lVar17 + 0x2c);
        in_XMM7._12_4_ = 0;
        fVar27 = *(float *)(pcVar6 + lVar17 + 0x10);
        fStack_3e4 = *(float *)(pcVar6 + lVar17 + 0x20);
        fVar41 = 0.0;
        fVar51 = *(float *)(pcVar6 + lVar17 + 0x14);
        fVar37 = *(float *)(pcVar6 + lVar17 + 0x24);
        fVar42 = 0.0;
      }
      else {
        fVar45 = 0.0;
        fVar48 = 0.0;
        if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar6 = pRVar5->ptr_ofs;
          lVar17 = i * pRVar5->stride;
          fVar44 = *(float *)(pcVar6 + lVar17);
          fVar40 = *(float *)(pcVar6 + lVar17 + 0xc);
          fVar45 = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x1c);
          fVar48 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x1c) >> 0x20);
          fVar30 = *(float *)(pcVar6 + lVar17 + 0x18);
          fVar50 = 0.0;
          in_XMM7._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar17 + 0x28);
          in_XMM7._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar17 + 0x24);
          in_XMM7._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x28) >> 0x20);
          in_XMM7._12_4_ = 0;
          fVar27 = (float)*(undefined8 *)(pcVar6 + lVar17 + 4);
          fStack_3e4 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 4) >> 0x20);
          fVar41 = 0.0;
          fVar51 = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x10);
          fVar37 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x10) >> 0x20);
          fVar42 = 0.0;
        }
      }
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar17 = i * pRVar5->stride;
      fVar30 = *(float *)(pcVar6 + lVar17 + 0x10);
      fVar45 = *(float *)((long)(pcVar6 + lVar17 + 0x10) + 4);
      fVar44 = *(float *)(pcVar6 + lVar17);
      fVar51 = *(float *)(pcVar6 + lVar17 + 4);
      fVar48 = *(float *)(pcVar6 + lVar17 + 8);
      fVar40 = *(float *)(pcVar6 + lVar17 + 0xc);
      fVar27 = (float)*(undefined8 *)(pcVar6 + lVar17 + 0x34);
      fVar2 = *(float *)(pcVar6 + lVar17 + 0x24);
      fVar41 = *(float *)(pcVar6 + lVar17 + 0x28);
      fVar42 = *(float *)(pcVar6 + lVar17 + 0x2c);
      fVar50 = *(float *)(pcVar6 + lVar17 + 0x30);
      fVar37 = fVar50 * fVar50 + fVar42 * fVar42 + fVar2 * fVar2 + fVar41 * fVar41;
      auVar38 = rsqrtss(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37));
      fVar57 = auVar38._0_4_;
      fVar57 = fVar57 * fVar57 * fVar37 * -0.5 * fVar57 + fVar57 * 1.5;
      fVar41 = fVar41 * fVar57;
      fVar42 = fVar42 * fVar57;
      fVar50 = fVar57 * fVar50;
      fStack_3e4 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x34) >> 0x20);
      fVar37 = *(float *)(pcVar6 + lVar17 + 0x3c);
      in_XMM7._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar17 + 0x1c);
      in_XMM7._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar17 + 0x18);
      in_XMM7._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar17 + 0x1c) >> 0x20);
      in_XMM7._12_4_ = fVar2 * fVar57;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar17 = i * pRVar5->stride;
      pfVar1 = (float *)(pcVar6 + lVar17);
      fVar44 = *pfVar1;
      fVar27 = pfVar1[1];
      fStack_3e4 = pfVar1[2];
      fVar41 = pfVar1[3];
      pfVar1 = (float *)(pcVar6 + lVar17 + 0x10);
      fVar40 = *pfVar1;
      fVar51 = pfVar1[1];
      fVar37 = pfVar1[2];
      fVar42 = pfVar1[3];
      pfVar1 = (float *)(pcVar6 + lVar17 + 0x20);
      fVar30 = *pfVar1;
      fVar45 = pfVar1[1];
      fVar48 = pfVar1[2];
      fVar50 = pfVar1[3];
      in_XMM7 = *(undefined1 (*) [16])(pcVar6 + lVar17 + 0x30);
    }
    in_XMM6_Da = in_XMM4_Da + fVar36;
    in_XMM6_Db = in_XMM4_Db + fVar39;
    in_XMM6_Dc = in_XMM4_Dc + fStack_4a0;
    in_XMM6_Dd = in_XMM4_Dd + fStack_49c;
    in_XMM13_Da = fVar43 + fVar24;
    in_XMM13_Db = fVar46 + fVar25;
    in_XMM13_Dc = fVar49 + fVar26;
    in_XMM13_Dd = fVar52 + fVar35;
    in_XMM14_Da = fVar53 + local_488;
    in_XMM14_Db = fVar54 + fStack_484;
    in_XMM14_Dc = fVar55 + fStack_480;
    in_XMM14_Dd = fVar56 + fStack_47c;
    local_518._4_4_ = fVar23 + fVar22;
    local_518._0_4_ = (float)local_518._0_4_ + fVar21;
    fStack_510 = fStack_510 + fStack_4b0;
    fStack_50c = fStack_50c + fStack_4ac;
    fVar24 = 1.0 - fVar47;
    in_XMM8._0_4_ = auVar33._0_4_ * fVar24 + fVar44 * fVar47;
    in_XMM8._4_4_ = auVar33._4_4_ * fVar24 + fVar27 * fVar47;
    in_XMM8._8_4_ = auVar33._8_4_ * fVar24 + fStack_3e4 * fVar47;
    in_XMM8._12_4_ = auVar33._12_4_ * fVar24 + fVar41 * fVar47;
    in_XMM12_Da = fVar28 * fVar24 + fVar40 * fVar47;
    in_XMM12_Db = fVar32 * fVar24 + fVar51 * fVar47;
    in_XMM12_Dc = fVar31 * fVar24 + fVar37 * fVar47;
    in_XMM12_Dd = fVar34 * fVar24 + fVar42 * fVar47;
    in_XMM15_Da = in_XMM15_Da * fVar24 + fVar30 * fVar47;
    in_XMM15_Db = in_XMM15_Db * fVar24 + fVar45 * fVar47;
    in_XMM15_Dc = in_XMM15_Dc * fVar24 + fVar48 * fVar47;
    in_XMM15_Dd = in_XMM15_Dd * fVar24 + fVar50 * fVar47;
    local_528 = fVar24 * in_XMM11_Da + fVar47 * in_XMM7._0_4_;
    fStack_524 = fVar24 * in_XMM11_Db + fVar47 * in_XMM7._4_4_;
    fStack_520 = fVar24 * in_XMM11_Dc + fVar47 * in_XMM7._8_4_;
    fStack_51c = fVar24 * in_XMM11_Dd + fVar47 * in_XMM7._12_4_;
LAB_009651b6:
  }
LAB_009651ba:
  *(undefined8 *)&(__return_storage_ptr__->upper).field_0 = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->upper).field_0 + 8) = 0;
  *(undefined8 *)&(__return_storage_ptr__->lower).field_0 = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->lower).field_0 + 8) = 0;
  fVar24 = in_XMM8._0_4_;
  fVar25 = in_XMM8._4_4_;
  fVar26 = in_XMM8._8_4_;
  fVar35 = in_XMM8._12_4_;
  uVar3 = *(undefined8 *)&(bbox1->lower).field_0;
  uVar11 = *(undefined8 *)((long)&(bbox1->lower).field_0 + 8);
  auVar38 = *(undefined1 (*) [16])(bbox1->upper).field_0.m128;
  uVar12 = *(undefined8 *)&(bbox0->lower).field_0;
  uVar13 = *(undefined8 *)((long)&(bbox0->lower).field_0 + 8);
  auVar29 = *(undefined1 (*) [16])(bbox0->upper).field_0.m128;
  bVar14 = true;
  do {
    bVar10 = bVar14;
    uVar16 = (ulong)(((byte)~bVar10 & 1) << 4);
    fVar40 = *(float *)((long)&(obbox0->lower).field_0 + uVar16);
    fVar30 = *(float *)((long)&(obbox1->lower).field_0 + uVar16);
    bVar14 = true;
    do {
      bVar9 = bVar14;
      uVar16 = (ulong)(((byte)~bVar9 & 1) << 4);
      fVar28 = *(float *)((long)&(obbox0->lower).field_0 + uVar16 + 4);
      fVar32 = *(float *)((long)&(obbox1->lower).field_0 + uVar16 + 4);
      bVar14 = true;
      do {
        bVar8 = bVar14;
        uVar16 = (ulong)(((byte)~bVar8 & 1) << 4);
        fVar31 = *(float *)((long)&(obbox0->lower).field_0 + uVar16 + 8);
        fVar34 = *(float *)((long)&(obbox1->lower).field_0 + uVar16 + 8);
        fVar44 = fVar40 - fVar30;
        fVar47 = fVar28 - fVar32;
        fVar50 = fVar31 - fVar34;
        fVar45 = fVar50 * (in_XMM14_Da - in_XMM15_Da) + fVar47 * (in_XMM13_Da - in_XMM12_Da) +
                 fVar44 * (in_XMM6_Da - fVar24);
        fVar48 = fVar50 * (in_XMM14_Db - in_XMM15_Db) + fVar47 * (in_XMM13_Db - in_XMM12_Db) +
                 fVar44 * (in_XMM6_Db - fVar25);
        fVar51 = fVar50 * (in_XMM14_Dc - in_XMM15_Dc) + fVar47 * (in_XMM13_Dc - in_XMM12_Dc) +
                 fVar44 * (in_XMM6_Dc - fVar26);
        fVar44 = fVar50 * (in_XMM14_Dd - in_XMM15_Dd) + fVar47 * (in_XMM13_Dd - in_XMM12_Dd) +
                 fVar44 * (in_XMM6_Dd - fVar35);
        denom.field_0.m128[1] = fVar48 + fVar48;
        denom.field_0.m128[0] = fVar45 + fVar45;
        denom.field_0.m128[2] = fVar51 + fVar51;
        denom.field_0.m128[3] = fVar44 + fVar44;
        fVar44 = in_XMM14_Da * fVar31 + (float)local_518._0_4_ + in_XMM13_Da * fVar28 +
                 in_XMM6_Da * fVar40;
        fVar45 = in_XMM14_Db * fVar31 + (float)local_518._4_4_ + in_XMM13_Db * fVar28 +
                 in_XMM6_Db * fVar40;
        fVar47 = in_XMM14_Dc * fVar31 + fStack_510 + in_XMM13_Dc * fVar28 + in_XMM6_Dc * fVar40;
        fVar48 = in_XMM14_Dd * fVar31 + fStack_50c + in_XMM13_Dd * fVar28 + in_XMM6_Dd * fVar40;
        nom.field_0.m128[1] =
             ((fVar45 + fVar45) -
             (fVar34 * in_XMM14_Db + (float)local_518._4_4_ + fVar32 * in_XMM13_Db +
             fVar30 * in_XMM6_Db)) -
             (fVar31 * in_XMM15_Db + fStack_524 + fVar28 * in_XMM12_Db + fVar40 * fVar25);
        nom.field_0.m128[0] =
             ((fVar44 + fVar44) -
             (fVar34 * in_XMM14_Da + (float)local_518._0_4_ + fVar32 * in_XMM13_Da +
             fVar30 * in_XMM6_Da)) -
             (fVar31 * in_XMM15_Da + local_528 + fVar28 * in_XMM12_Da + fVar40 * fVar24);
        nom.field_0.m128[2] =
             ((fVar47 + fVar47) -
             (fVar34 * in_XMM14_Dc + fStack_510 + fVar32 * in_XMM13_Dc + fVar30 * in_XMM6_Dc)) -
             (fVar31 * in_XMM15_Dc + fStack_520 + fVar28 * in_XMM12_Dc + fVar40 * fVar26);
        nom.field_0.m128[3] =
             ((fVar48 + fVar48) -
             (fVar34 * in_XMM14_Dd + fStack_50c + fVar32 * in_XMM13_Dd + fVar30 * in_XMM6_Dd)) -
             (fVar31 * in_XMM15_Dd + fStack_51c + fVar28 * in_XMM12_Dd + fVar40 * fVar35);
        lVar17 = 0;
        do {
          fVar44 = *(float *)((long)&denom.field_0 + lVar17);
          if (fVar44 != 0.0) {
            fVar45 = *(float *)(local_458 + lVar17 + -0x10);
            fVar47 = ((*(float *)((long)&(bbox1->lower).field_0 + lVar17) -
                      *(float *)((long)&(bbox0->lower).field_0 + lVar17)) + fVar45) / fVar44;
            local_4b8._0_4_ = auVar38._0_4_;
            local_4b8._4_4_ = auVar38._4_4_;
            fStack_4b0 = auVar38._8_4_;
            local_4c8 = auVar29._0_4_;
            fStack_4c4 = auVar29._4_4_;
            fStack_4c0 = auVar29._8_4_;
            if ((tmin <= fVar47) && (fVar47 <= tmax)) {
              fVar48 = 1.0 - fVar47;
              local_4f8 = (float)uVar3;
              fStack_4f4 = (float)((ulong)uVar3 >> 0x20);
              fStack_4f0 = (float)uVar11;
              local_478 = (float)uVar12;
              fStack_474 = (float)((ulong)uVar12 >> 0x20);
              fStack_470 = (float)uVar13;
              bt.lower.field_0.m128[0] = local_478 * fVar48 + local_4f8 * fVar47;
              bt.lower.field_0.m128[1] = fStack_474 * fVar48 + fStack_4f4 * fVar47;
              bt.lower.field_0.m128[2] = fStack_470 * fVar48 + fStack_4f0 * fVar47;
              bt.upper.field_0.m128[0] = local_4c8 * fVar48 + (float)local_4b8._0_4_ * fVar47;
              bt.upper.field_0.m128[1] = fStack_4c4 * fVar48 + (float)local_4b8._4_4_ * fVar47;
              bt.upper.field_0.m128[2] = fStack_4c0 * fVar48 + fStack_4b0 * fVar47;
              fVar50 = fVar48 * fVar40 + fVar47 * fVar30;
              fVar51 = fVar48 * fVar28 + fVar47 * fVar32;
              fVar41 = fVar48 * fVar31 + fVar47 * fVar34;
              pt.field_0.m128[1] =
                   fVar41 * (in_XMM14_Db * fVar48 + in_XMM15_Db * fVar47) +
                   (float)local_518._4_4_ * fVar48 + fStack_524 * fVar47 +
                   fVar51 * (in_XMM13_Db * fVar48 + in_XMM12_Db * fVar47) +
                   fVar50 * (in_XMM6_Db * fVar48 + fVar25 * fVar47);
              pt.field_0.m128[0] =
                   fVar41 * (in_XMM14_Da * fVar48 + in_XMM15_Da * fVar47) +
                   (float)local_518._0_4_ * fVar48 + local_528 * fVar47 +
                   fVar51 * (in_XMM13_Da * fVar48 + in_XMM12_Da * fVar47) +
                   fVar50 * (in_XMM6_Da * fVar48 + fVar24 * fVar47);
              pt.field_0.m128[3] =
                   fVar41 * (in_XMM14_Dd * fVar48 + in_XMM15_Dd * fVar47) +
                   fStack_50c * fVar48 + fStack_51c * fVar47 +
                   fVar51 * (in_XMM13_Dd * fVar48 + in_XMM12_Dd * fVar47) +
                   fVar50 * (in_XMM6_Dd * fVar48 + fVar35 * fVar47);
              pt.field_0.m128[2] =
                   fVar41 * (in_XMM14_Dc * fVar48 + in_XMM15_Dc * fVar47) +
                   fStack_510 * fVar48 + fStack_520 * fVar47 +
                   fVar51 * (in_XMM13_Dc * fVar48 + in_XMM12_Dc * fVar47) +
                   fVar50 * (in_XMM6_Dc * fVar48 + fVar26 * fVar47);
              fVar48 = *(float *)((long)&pt.field_0 + lVar17) -
                       *(float *)((long)&bt.lower.field_0 + lVar17);
              fVar47 = *(float *)((long)&(__return_storage_ptr__->lower).field_0 + lVar17);
              if (fVar47 <= fVar48) {
                fVar48 = fVar47;
              }
              *(float *)((long)&(__return_storage_ptr__->lower).field_0 + lVar17) = fVar48;
            }
            fVar44 = (fVar45 + (*(float *)((long)&(bbox1->upper).field_0 + lVar17) -
                               *(float *)((long)&(bbox0->upper).field_0 + lVar17))) / fVar44;
            if ((tmin <= fVar44) && (fVar44 <= tmax)) {
              fVar45 = 1.0 - fVar44;
              bt.upper.field_0.m128[0] = local_4c8 * fVar45 + (float)local_4b8._0_4_ * fVar44;
              bt.upper.field_0.m128[1] = fStack_4c4 * fVar45 + (float)local_4b8._4_4_ * fVar44;
              bt.upper.field_0.m128[2] = fStack_4c0 * fVar45 + fStack_4b0 * fVar44;
              fVar47 = fVar45 * fVar40 + fVar44 * fVar30;
              fVar48 = fVar45 * fVar28 + fVar44 * fVar32;
              fVar50 = fVar45 * fVar31 + fVar44 * fVar34;
              pt.field_0.m128[1] =
                   fVar50 * (in_XMM14_Db * fVar45 + in_XMM15_Db * fVar44) +
                   (float)local_518._4_4_ * fVar45 + fStack_524 * fVar44 +
                   fVar48 * (in_XMM13_Db * fVar45 + in_XMM12_Db * fVar44) +
                   fVar47 * (in_XMM6_Db * fVar45 + fVar25 * fVar44);
              pt.field_0.m128[0] =
                   fVar50 * (in_XMM14_Da * fVar45 + in_XMM15_Da * fVar44) +
                   (float)local_518._0_4_ * fVar45 + local_528 * fVar44 +
                   fVar48 * (in_XMM13_Da * fVar45 + in_XMM12_Da * fVar44) +
                   fVar47 * (in_XMM6_Da * fVar45 + fVar24 * fVar44);
              pt.field_0.m128[3] =
                   fVar50 * (in_XMM14_Dd * fVar45 + in_XMM15_Dd * fVar44) +
                   fStack_50c * fVar45 + fStack_51c * fVar44 +
                   fVar48 * (in_XMM13_Dd * fVar45 + in_XMM12_Dd * fVar44) +
                   fVar47 * (in_XMM6_Dd * fVar45 + fVar35 * fVar44);
              pt.field_0.m128[2] =
                   fVar50 * (in_XMM14_Dc * fVar45 + in_XMM15_Dc * fVar44) +
                   fStack_510 * fVar45 + fStack_520 * fVar44 +
                   fVar48 * (in_XMM13_Dc * fVar45 + in_XMM12_Dc * fVar44) +
                   fVar47 * (in_XMM6_Dc * fVar45 + fVar26 * fVar44);
              fVar45 = *(float *)((long)&pt.field_0 + lVar17) -
                       *(float *)((long)&bt.upper.field_0 + lVar17);
              fVar44 = *(float *)((long)&(__return_storage_ptr__->upper).field_0 + lVar17);
              if (fVar45 <= fVar44) {
                fVar45 = fVar44;
              }
              *(float *)((long)&(__return_storage_ptr__->upper).field_0 + lVar17) = fVar45;
            }
          }
          lVar17 = lVar17 + 4;
        } while (lVar17 != 0xc);
        bVar14 = false;
      } while (bVar8);
      bVar14 = false;
    } while (bVar9);
    bVar14 = false;
  } while (bVar10);
  return __return_storage_ptr__;
}

Assistant:

BBox3fa InstanceArray::boundSegment(size_t i, size_t itime,
      BBox3fa const& obbox0, BBox3fa const& obbox1,
      BBox3fa const& bbox0, BBox3fa const& bbox1,
      float tmin, float tmax) const
  {
    if (unlikely(gsubtype == GTY_SUBTYPE_INSTANCE_QUATERNION)) {
      auto const& xfm0 = l2w(i, itime);
      auto const& xfm1 = l2w(i, itime+1);
      MotionDerivativeCoefficients motionDerivCoeffs(xfm0, xfm1);
      return boundSegmentNonlinear(motionDerivCoeffs, xfm0, xfm1, obbox0, obbox1, bbox0, bbox1, tmin, tmax);
    } else {
      auto const& xfm0 = getLocal2World(i, itime);
      auto const& xfm1 = getLocal2World(i, itime+1);
      return boundSegmentLinear(xfm0, xfm1, obbox0, obbox1, bbox0, bbox1, tmin, tmax);
    }
  }